

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QPoint __thiscall QIconModeViewBase::draggedItemsDelta(QIconModeViewBase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QListViewPrivate *pQVar4;
  QWidget *pQVar5;
  QSize QVar6;
  LayoutDirection LVar7;
  int iVar8;
  int iVar9;
  QPoint QVar10;
  Representation RVar11;
  Representation RVar12;
  Representation RVar13;
  Representation RVar14;
  
  pQVar4 = (this->super_QCommonListViewBase).dd;
  if (pQVar4->movement == Snap) {
    pQVar5 = *(QWidget **)
              &(pQVar4->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    LVar7 = QWidget::layoutDirection(pQVar5);
    iVar8 = (**(code **)(*(long *)pQVar5 + 0x2b0))(pQVar5);
    if (LVar7 == RightToLeft) {
      iVar8 = -iVar8;
    }
    (**(code **)(*(long *)pQVar5 + 0x2b8))(pQVar5);
    pQVar4 = (this->super_QCommonListViewBase).dd;
    iVar1 = (pQVar4->grid).wd.m_i;
    pQVar5 = *(QWidget **)
              &(pQVar4->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    QWidget::layoutDirection(pQVar5);
    (**(code **)(*(long *)pQVar5 + 0x2b0))(pQVar5);
    iVar9 = (**(code **)(*(long *)pQVar5 + 0x2b8))(pQVar5);
    pQVar4 = (this->super_QCommonListViewBase).dd;
    QVar10 = (pQVar4->super_QAbstractItemViewPrivate).pressedPosition;
    QVar6 = pQVar4->grid;
    RVar13 = QVar6.ht.m_i;
    iVar2 = (this->draggedItemsPos).xp.m_i;
    iVar3 = (this->draggedItemsPos).yp.m_i;
    RVar14 = QVar6.wd.m_i;
    RVar11.m_i = ((int)((long)((ulong)(uint)(QVar10.xp.m_i.m_i >> 0x1f) << 0x20 |
                              (ulong)QVar10 & 0xffffffff) % (long)RVar14.m_i) + iVar2) -
                 ((iVar8 % iVar1 + iVar2) % RVar14.m_i + QVar10.xp.m_i.m_i);
    RVar12.m_i = ((int)((long)((ulong)(uint)(QVar10.yp.m_i.m_i >> 0x1f) << 0x20 |
                              (ulong)QVar10 >> 0x20) % (long)RVar13.m_i) + iVar3) -
                 ((iVar9 % RVar13.m_i + iVar3) % RVar13.m_i + QVar10.yp.m_i.m_i);
  }
  else {
    QVar10 = (pQVar4->super_QAbstractItemViewPrivate).pressedPosition;
    RVar11.m_i = (this->draggedItemsPos).xp.m_i - QVar10.xp.m_i;
    RVar12.m_i = (this->draggedItemsPos).yp.m_i - QVar10.yp.m_i;
  }
  QVar10.yp.m_i = RVar12.m_i;
  QVar10.xp.m_i = RVar11.m_i;
  return QVar10;
}

Assistant:

QPoint QIconModeViewBase::draggedItemsDelta() const
{
    if (movement() == QListView::Snap) {
        QPoint snapdelta = QPoint((offset().x() % gridSize().width()),
                                  (offset().y() % gridSize().height()));
        return snapToGrid(draggedItemsPos + snapdelta) - snapToGrid(pressedPosition()) - snapdelta;
    }
    return draggedItemsPos - pressedPosition();
}